

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cylinder.cpp
# Opt level: O0

Tuple4d * __thiscall
geometry::primitive::Cylinder::local_normal
          (Tuple4d *__return_storage_ptr__,Cylinder *this,Tuple4d *point,Intersection *hit)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double distance;
  Intersection *hit_local;
  Tuple4d *point_local;
  Cylinder *this_local;
  
  pdVar1 = math::Tuple4d::operator()(point,0);
  dVar2 = pow(*pdVar1,2.0);
  pdVar1 = math::Tuple4d::operator()(point,2);
  dVar3 = pow(*pdVar1,2.0);
  if (((this->m_closed & 1U) == 0) || (1.0 <= dVar2 + dVar3 + 1e-05)) {
    pdVar1 = math::Tuple4d::operator()(point,0);
    dVar2 = *pdVar1;
    pdVar1 = math::Tuple4d::operator()(point,2);
    math::vector(__return_storage_ptr__,dVar2,0.0,*pdVar1);
  }
  else {
    pdVar1 = math::Tuple4d::operator()(point,1);
    if (*pdVar1 < this->m_minmax[1] - 1e-05) {
      math::vector(__return_storage_ptr__,0.0,-1.0,0.0);
    }
    else {
      math::vector(__return_storage_ptr__,0.0,1.0,0.0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d geometry::primitive::Cylinder::local_normal(const math::Tuple4d &point, const core::Intersection &hit) const
{
    double distance = pow(point(0), 2) + pow(point(2), 2);
    if (m_closed && distance + constants::EPSILON < 1)
    {
	if (point(1) >= (m_minmax[1] - constants::EPSILON))
	    return math::vector(0, 1, 0);
	else
	    return math::vector(0, -1, 0);
    }
    return math::vector(point(0), 0, point(2));
}